

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O2

int tr_tcp_open(void *tr_socket)

{
  long lVar1;
  bool bVar2;
  uint __i;
  int iVar3;
  uint uVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  tr_tcp_socket *tmp;
  undefined8 uVar8;
  char *frmt;
  undefined8 uVar9;
  long in_FS_OFFSET;
  int oldcancelstate;
  timeval timeout;
  addrinfo *bind_addrinfo;
  addrinfo *res;
  addrinfo local_e8;
  socklen_t local_b0;
  int result;
  fd_set wfds;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*tr_socket != -1) {
    __assert_fail("tcp_socket->socket == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/transport/tcp/tcp_transport.c"
                  ,99,"int tr_tcp_open(void *)");
  }
  res = (addrinfo *)0x0;
  bind_addrinfo = (addrinfo *)0x0;
  local_e8.ai_addrlen = 0;
  local_e8._20_4_ = 0;
  local_e8.ai_addr = (sockaddr *)0x0;
  local_e8.ai_canonname = (char *)0x0;
  local_e8.ai_next = (addrinfo *)0x0;
  local_e8.ai_socktype = 1;
  local_e8.ai_protocol = 0;
  local_e8.ai_flags = 0x20;
  local_e8.ai_family = 0;
  if (*(code **)((long)tr_socket + 0x28) == (code *)0x0) {
    iVar3 = getaddrinfo(*(char **)((long)tr_socket + 8),*(char **)((long)tr_socket + 0x10),&local_e8
                        ,(addrinfo **)&res);
    if (iVar3 != 0) {
      if (iVar3 == -0xb) {
        uVar9 = *(undefined8 *)((long)tr_socket + 8);
        uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
      }
      else {
        uVar9 = *(undefined8 *)((long)tr_socket + 8);
        uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
        pcVar6 = gai_strerror(iVar3);
      }
      lrtr_dbg("TCP Transport(%s:%s): getaddrinfo error, %s",uVar9,uVar8,pcVar6);
      iVar3 = -1;
      goto LAB_001076a7;
    }
    iVar3 = socket(res->ai_family,res->ai_socktype,res->ai_protocol);
    *(int *)tr_socket = iVar3;
    if (iVar3 == -1) {
      uVar9 = *(undefined8 *)((long)tr_socket + 8);
      uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      frmt = "TCP Transport(%s:%s): Socket creation failed, %s";
LAB_001075ce:
      lrtr_dbg(frmt,uVar9,uVar8,pcVar6);
    }
    else {
      if (*(char **)((long)tr_socket + 0x18) != (char *)0x0) {
        iVar3 = getaddrinfo(*(char **)((long)tr_socket + 0x18),(char *)0x0,&local_e8,
                            (addrinfo **)&bind_addrinfo);
        if (iVar3 == 0) {
          iVar3 = bind(*tr_socket,(sockaddr *)bind_addrinfo->ai_addr,bind_addrinfo->ai_addrlen);
          if (iVar3 == 0) {
            freeaddrinfo((addrinfo *)bind_addrinfo);
            bind_addrinfo = (addrinfo *)0x0;
            iVar3 = *tr_socket;
            goto LAB_001076f0;
          }
          uVar9 = *(undefined8 *)((long)tr_socket + 8);
          uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          frmt = "TCP Transport(%s:%s): Socket bind failed, %s";
        }
        else {
          if (iVar3 == -0xb) {
            uVar9 = *(undefined8 *)((long)tr_socket + 8);
            uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
            piVar5 = __errno_location();
            pcVar6 = strerror(*piVar5);
          }
          else {
            uVar9 = *(undefined8 *)((long)tr_socket + 8);
            uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
            pcVar6 = gai_strerror(iVar3);
          }
          frmt = "TCP Transport(%s:%s): getaddrinfo error, %s";
        }
        goto LAB_001075ce;
      }
LAB_001076f0:
      uVar4 = fcntl(iVar3,3);
      if ((uVar4 == 0xffffffff) || (iVar3 = fcntl(iVar3,4,(ulong)(uVar4 | 0x800)), iVar3 == -1)) {
        uVar9 = *(undefined8 *)((long)tr_socket + 8);
        uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        frmt = "TCP Transport(%s:%s): Could not set socket to non blocking, %s";
        goto LAB_001075ce;
      }
      iVar3 = connect(*tr_socket,(sockaddr *)res->ai_addr,res->ai_addrlen);
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        if (iVar3 != 0x73) {
          uVar9 = *(undefined8 *)((long)tr_socket + 8);
          uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
          goto LAB_001075c2;
        }
      }
      freeaddrinfo((addrinfo *)res);
      res = (addrinfo *)0x0;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
        wfds.__fds_bits[lVar7] = 0;
      }
      wfds.__fds_bits[*tr_socket / 0x40] =
           wfds.__fds_bits[*tr_socket / 0x40] | 1L << ((byte)*tr_socket & 0x3f);
      timeout.tv_sec = (__time_t)*(uint *)((long)tr_socket + 0x30);
      timeout.tv_usec = 0;
      pthread_setcancelstate(0,&oldcancelstate);
      iVar3 = select(*tr_socket + 1,(fd_set *)0x0,(fd_set *)&wfds,(fd_set *)0x0,(timeval *)&timeout)
      ;
      pthread_setcancelstate(1,&oldcancelstate);
      if (iVar3 < 0) {
        uVar9 = *(undefined8 *)((long)tr_socket + 8);
        uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        frmt = "TCP Transport(%s:%s): Could not select tcp socket, %s";
        goto LAB_001075ce;
      }
      if (iVar3 != 0) {
        local_b0 = 4;
        iVar3 = getsockopt(*tr_socket,1,4,&result,&local_b0);
        if (result == -1 || iVar3 < 0) {
          uVar9 = *(undefined8 *)((long)tr_socket + 8);
          uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          frmt = "TCP Transport(%s:%s): Could not get socket error, %s";
        }
        else if (result < 1) {
          iVar3 = *tr_socket;
          uVar4 = fcntl(iVar3,3);
          if ((uVar4 != 0xffffffff) &&
             (iVar3 = fcntl(iVar3,4,(ulong)(uVar4 & 0xfffff7ff)), iVar3 != -1)) goto LAB_00107555;
          uVar9 = *(undefined8 *)((long)tr_socket + 8);
          uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          frmt = "TCP Transport(%s:%s): Could not set socket to blocking, %s";
        }
        else {
          uVar9 = *(undefined8 *)((long)tr_socket + 8);
          uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
          pcVar6 = strerror(result);
          frmt = "TCP Transport(%s:%s): Could not establish TCP connection, %s";
        }
        goto LAB_001075ce;
      }
      lrtr_dbg("TCP Transport(%s:%s): Could not establish TCP connection in time",
               *(undefined8 *)((long)tr_socket + 8),*(undefined8 *)((long)tr_socket + 0x10));
    }
    iVar3 = -1;
    bVar2 = true;
  }
  else {
    iVar3 = (**(code **)((long)tr_socket + 0x28))(*(undefined8 *)((long)tr_socket + 0x20));
    *(int *)tr_socket = iVar3;
    if (iVar3 < 1) {
      uVar9 = *(undefined8 *)((long)tr_socket + 8);
      uVar8 = *(undefined8 *)((long)tr_socket + 0x10);
      piVar5 = __errno_location();
      iVar3 = *piVar5;
LAB_001075c2:
      pcVar6 = strerror(iVar3);
      frmt = "TCP Transport(%s:%s): Couldn\'t establish TCP connection, %s";
      goto LAB_001075ce;
    }
LAB_00107555:
    bVar2 = false;
    lrtr_dbg("TCP Transport(%s:%s): Connection established",*(undefined8 *)((long)tr_socket + 8),
             *(undefined8 *)((long)tr_socket + 0x10));
    iVar3 = 0;
  }
  if (res != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)res);
  }
  if (bind_addrinfo != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)bind_addrinfo);
  }
  if (bVar2) {
    tr_tcp_close(tr_socket);
  }
LAB_001076a7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int tr_tcp_open(void *tr_socket)
{
	int rtval = TR_ERROR;
	int tcp_rtval = 0;
	struct tr_tcp_socket *tcp_socket = tr_socket;
	const struct tr_tcp_config *config = &tcp_socket->config;

	assert(tcp_socket->socket == -1);

	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct addrinfo *bind_addrinfo = NULL;

	bzero(&hints, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_ADDRCONFIG;

	if (config->new_socket) {
		tcp_socket->socket = (*config->new_socket)(config->data);
		if (tcp_socket->socket <= 0) {
			TCP_DBG("Couldn't establish TCP connection, %s", tcp_socket, strerror(errno));
			goto end;
		}
	}
	if (tcp_socket->socket < 0) {
		tcp_rtval = getaddrinfo(config->host, config->port, &hints, &res);
		if (tcp_rtval != 0) {
			if (tcp_rtval == EAI_SYSTEM) {
				TCP_DBG("getaddrinfo error, %s", tcp_socket, strerror(errno));
			} else {
				TCP_DBG("getaddrinfo error, %s", tcp_socket, gai_strerror(tcp_rtval));
			}
			return TR_ERROR;
		}

		tcp_socket->socket = socket(res->ai_family, res->ai_socktype, res->ai_protocol);
		if (tcp_socket->socket == -1) {
			TCP_DBG("Socket creation failed, %s", tcp_socket, strerror(errno));
			goto end;
		}

		if (tcp_socket->config.bindaddr) {
			tcp_rtval = getaddrinfo(tcp_socket->config.bindaddr, 0, &hints, &bind_addrinfo);
			if (tcp_rtval != 0) {
				if (tcp_rtval == EAI_SYSTEM) {
					TCP_DBG("getaddrinfo error, %s", tcp_socket, strerror(errno));
				} else {
					TCP_DBG("getaddrinfo error, %s", tcp_socket, gai_strerror(tcp_rtval));
				}
				goto end;
			}
			if (bind(tcp_socket->socket, bind_addrinfo->ai_addr, bind_addrinfo->ai_addrlen) != 0) {
				TCP_DBG("Socket bind failed, %s", tcp_socket, strerror(errno));
				goto end;
			}

			freeaddrinfo(bind_addrinfo);
			bind_addrinfo = NULL;
		}

		if (set_socket_non_blocking(tcp_socket->socket) == TR_ERROR) {
			TCP_DBG("Could not set socket to non blocking, %s", tcp_socket, strerror(errno));
			goto end;
		}

		if (connect(tcp_socket->socket, res->ai_addr, res->ai_addrlen) == -1 && errno != EINPROGRESS) {
			TCP_DBG("Couldn't establish TCP connection, %s", tcp_socket, strerror(errno));
			goto end;
		}

		freeaddrinfo(res);
		res = NULL;

		fd_set wfds;

		FD_ZERO(&wfds);
		FD_SET(tcp_socket->socket, &wfds);

		struct timeval timeout = {.tv_sec = tcp_socket->config.connect_timeout, .tv_usec = 0};
		int oldcancelstate;

		/* Enable cancellability for the select call
		 * to prevent rtr_stop from blocking for a long time.
		 * It must be the only blocking call in this function.
		 * Since local resources have all been freed this should be safe.
		 */
		pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, &oldcancelstate);
		int ret = select(tcp_socket->socket + 1, NULL, &wfds, NULL, &timeout);

		pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &oldcancelstate);

		if (ret < 0) {
			TCP_DBG("Could not select tcp socket, %s", tcp_socket, strerror(errno));
			goto end;

		} else if (ret == 0) {
			TCP_DBG("Could not establish TCP connection in time", tcp_socket);
			goto end;
		}

		int socket_error = get_socket_error(tcp_socket->socket);

		if (socket_error == TR_ERROR) {
			TCP_DBG("Could not get socket error, %s", tcp_socket, strerror(errno));
			goto end;

		} else if (socket_error > 0) {
			TCP_DBG("Could not establish TCP connection, %s", tcp_socket, strerror(socket_error));
			goto end;
		}

		if (set_socket_blocking(tcp_socket->socket) == TR_ERROR) {
			TCP_DBG("Could not set socket to blocking, %s", tcp_socket, strerror(errno));
			goto end;
		}
	}

	TCP_DBG1("Connection established", tcp_socket);
	rtval = TR_SUCCESS;

end:
	if (res)
		freeaddrinfo(res);

	if (bind_addrinfo)
		freeaddrinfo(bind_addrinfo);
	if (rtval == -1)
		tr_tcp_close(tr_socket);
	return rtval;
}